

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
pugi::impl::(anonymous_namespace)::as_wide_impl_abi_cxx11_
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char *str,size_t size)

{
  pointer result;
  pointer pwVar1;
  char *pcVar2;
  long lVar3;
  _anonymous_namespace_ *p_Var4;
  long lVar5;
  _anonymous_namespace_ *p_Var6;
  long lVar7;
  
  lVar7 = 0;
  pcVar2 = str;
  p_Var6 = this;
  do {
    do {
      p_Var4 = p_Var6;
      lVar3 = 0;
      lVar5 = 3;
      while( true ) {
        if (pcVar2 + lVar3 == (char *)0x0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
          std::__cxx11::wstring::resize((ulong)__return_storage_ptr__);
          if ((lVar7 != 0) &&
             (result = (__return_storage_ptr__->_M_dataplus)._M_p,
             pwVar1 = (pointer)anon_unknown_0::
                               utf_decoder<pugi::impl::(anonymous_namespace)::utf32_writer,_pugi::impl::(anonymous_namespace)::opt_false>
                               ::decode_utf8_block((uint8_t *)this,(size_t)str,(value_type)result),
             result + lVar7 != pwVar1)) {
            __assert_fail("begin + length == end",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                          ,0x5e0,
                          "std::basic_string<wchar_t> pugi::impl::(anonymous namespace)::as_wide_impl(const char *, size_t)"
                         );
          }
          return __return_storage_ptr__;
        }
        if (-1 < (char)p_Var4[lVar5 + -3]) break;
        lVar3 = lVar3 + -1;
        lVar5 = lVar5 + 1;
      }
      lVar7 = lVar7 + 1;
      p_Var6 = p_Var4 + (1 - lVar3);
      pcVar2 = pcVar2 + lVar3 + -1;
    } while ((pcVar2 < (char *)0x4) || ((((int)p_Var4 - (int)lVar3) + 1U & 3) != 0));
    do {
      if ((*(uint *)p_Var6 & 0x80808080) != 0) break;
      lVar7 = lVar7 + 4;
      p_Var6 = p_Var6 + 4;
      pcVar2 = pcVar2 + -4;
    } while ((char *)0x3 < pcVar2);
  } while( true );
}

Assistant:

PUGI__FN std::basic_string<wchar_t> as_wide_impl(const char* str, size_t size)
	{
		const uint8_t* data = reinterpret_cast<const uint8_t*>(str);

		// first pass: get length in wchar_t units
		size_t length = utf_decoder<wchar_counter>::decode_utf8_block(data, size, 0);

		// allocate resulting string
		std::basic_string<wchar_t> result;
		result.resize(length);

		// second pass: convert to wchar_t
		if (length > 0)
		{
			wchar_writer::value_type begin = reinterpret_cast<wchar_writer::value_type>(&result[0]);
			wchar_writer::value_type end = utf_decoder<wchar_writer>::decode_utf8_block(data, size, begin);

			assert(begin + length == end);
			(void)!end;
		}

		return result;
	}